

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

void Mpm_ObjRecycleCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int *piVar1;
  uint *__s;
  Mmr_Step_t *pMVar2;
  long lVar3;
  uint uVar4;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint Entry;
  ulong uVar5;
  
  uVar4 = (uint)pObj->pFans[3] >> 1;
  uVar5 = (ulong)uVar4;
  iVar7 = (p->vCutLists).nSize;
  if (iVar7 <= (int)uVar4) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar4 = (p->vCutLists).pArray[uVar5];
  if (uVar4 != 0) {
    do {
      pMVar2 = p->pManCuts;
      uVar8 = pMVar2->uMask & uVar4;
      if ((int)uVar8 < 1) {
        __assert_fail("(h & p->uMask) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
      }
      Entry = (int)uVar4 >> ((byte)pMVar2->nBits & 0x1f);
      if ((int)Entry < 1) {
LAB_004807b8:
        __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
      }
      iVar7 = *(int *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x34);
      bVar6 = (byte)*(undefined4 *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x18);
      if (iVar7 << (bVar6 & 0x1f) <= (int)Entry) goto LAB_004807b8;
      uVar4 = Entry >> (bVar6 & 0x1f);
      if (iVar7 <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar3 = *(long *)(*(long *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x38) + (ulong)uVar4 * 8);
      uVar5 = (ulong)(*(uint *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x1c) & Entry);
      if ((*(uint *)(lVar3 + 4 + uVar5 * 8) >> 0x19) + 0xc >> 3 != uVar8) {
        __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                      ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
      }
      __s = (uint *)(lVar3 + uVar5 * 8);
      uVar4 = *__s;
      pMVar2->nEntries = pMVar2->nEntries + -1;
      piVar1 = (int *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x24);
      *piVar1 = *piVar1 + -1;
      memset(__s,0xff,(long)*(int *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x20) << 3);
      Vec_IntPush((Vec_Int_t *)((long)pMVar2 + (ulong)uVar8 * 0x38 + 0x40),Entry);
    } while (uVar4 != 0);
    iVar7 = (p->vCutLists).nSize;
    uVar5 = (ulong)((uint)pObj->pFans[3] >> 1);
  }
  if (iVar7 <= (int)uVar5) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vCutLists).pArray[uVar5] = 0;
  return;
}

Assistant:

static inline void Mpm_ObjRecycleCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext;
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
        Mmr_StepRecycle( p->pManCuts, hCut );
    Mpm_ObjSetCutList( p, pObj, 0 );
}